

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O2

void qp_push_ptr(priority_queue *qp,wchar_t priority,void *payload)

{
  ulong uVar1;
  priority_queue_element *ppVar2;
  
  if ((qp != (priority_queue *)0x0) && (uVar1 = qp->count, uVar1 < qp->size)) {
    ppVar2 = qp->data;
    ppVar2[uVar1].priority = priority;
    ppVar2[uVar1].payload.p = payload;
    up_heap(qp,qp->count);
    qp->count = qp->count + 1;
    return;
  }
  __assert_fail("qp && qp->count < qp->size",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-queue.c"
                ,0x153,"void qp_push_ptr(struct priority_queue *, int, void *)");
}

Assistant:

void qp_push_ptr(struct priority_queue *qp, int priority, void *payload)
{
	assert(qp && qp->count < qp->size);
	qp->data[qp->count].priority = priority;
	qp->data[qp->count].payload.p = payload;
	up_heap(qp, qp->count);
	++qp->count;
}